

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

value_type __thiscall djb::fresnel::sgd::eval(sgd *this,float_t zd)

{
  float *extraout_RDX;
  long in_RSI;
  double dVar1;
  value_type vVar2;
  _Expr<std::__detail::_BinClos<std::__plus,_std::_Expr,_std::_Expr,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>,_float>
  local_48;
  
  if ((0.0 <= zd) && (zd <= 1.0)) {
    dVar1 = pow((double)(1.0 - zd),5.0);
    local_48._M_closure.
    super__BinBase<std::__plus,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
    ._M_expr2.
    super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
    ._M_expr1 = (_Vt)dVar1;
    local_48._M_closure.
    super__BinBase<std::__plus,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
    ._M_expr2.
    super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
    ._M_expr2.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr1 = 1.0;
    local_48._M_closure.
    super__BinBase<std::__plus,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
    ._M_expr1.
    super__BinBase<std::__minus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>
    ._M_expr1 = (__type)(in_RSI + 8);
    local_48._M_closure.
    super__BinBase<std::__plus,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
    ._M_expr1.
    super__BinBase<std::__minus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>
    ._M_expr2.super__BinBase1<std::__multiplies,_std::valarray<float>_>._M_expr1 = zd;
    local_48._M_closure.
    super__BinBase<std::__plus,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
    ._M_expr1.
    super__BinBase<std::__minus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>
    ._M_expr2.super__BinBase1<std::__multiplies,_std::valarray<float>_>._M_expr2 =
         (__type)(in_RSI + 0x18);
    local_48._M_closure.
    super__BinBase<std::__plus,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
    ._M_expr2.
    super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
    ._M_expr2.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr2 = (__type)(in_RSI + 8);
    std::valarray<float>::
    valarray<std::__detail::_BinClos<std::__plus,std::_Expr,std::_Expr,std::__detail::_BinClos<std::__minus,std::_ValArray,std::_Expr,float,std::__detail::_BinClos<std::__multiplies,std::_Constant,std::_ValArray,float,float>>,std::__detail::_BinClos<std::__multiplies,std::_Constant,std::_Expr,float,std::__detail::_BinClos<std::__minus,std::_Constant,std::_ValArray,float,float>>>>
              ((valarray<float> *)this,&local_48);
    vVar2._M_data = extraout_RDX;
    vVar2._M_size = (size_t)this;
    return vVar2;
  }
  __assert_fail("zd >= 0 && zd <= 1 && \"Invalid Angle\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x493,"virtual brdf::value_type djb::fresnel::sgd::eval(float_t) const");
}

Assistant:

brdf::value_type sgd::eval(float_t zd) const
{
	DJB_ASSERT(zd >= 0 && zd <= 1 && "Invalid Angle");
	float_t c = zd;

	return f0 - c * f1 + pow(1 - c, 5) * ((float_t)1 - f0);
}